

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

CompatibilityTestType __thiscall deqp::gls::DrawTestSpec::isCompatibilityTest(DrawTestSpec *this)

{
  int iVar1;
  CompatibilityTestType CVar2;
  int iVar3;
  ulong uVar4;
  pointer pAVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  pointer pAVar10;
  
  pAVar5 = (this->attribs).
           super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (int)((long)(this->attribs).
                      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar5 >> 3) * -0x33333333;
  CVar2 = COMPATIBILITY_NONE;
  if ((int)uVar6 < 1) {
    bVar7 = false;
  }
  else {
    uVar4 = (ulong)(uVar6 & 0x7fffffff);
    pAVar10 = pAVar5;
    bVar8 = false;
    do {
      if (pAVar10->storage == STORAGE_BUFFER) {
        iVar9 = 4;
        if ((pAVar10->inputType & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          iVar9 = inputTypeSize::size[(int)pAVar10->inputType];
        }
        bVar7 = true;
        if (pAVar10->offset % iVar9 == 0) goto LAB_00809d76;
      }
      else {
LAB_00809d76:
        bVar7 = bVar8;
      }
      pAVar10 = pAVar10 + 1;
      uVar4 = uVar4 - 1;
      bVar8 = bVar7;
    } while (uVar4 != 0);
  }
  if (0 < (int)uVar6) {
    uVar4 = (ulong)(uVar6 & 0x7fffffff);
    iVar9 = 0;
    do {
      if (pAVar5->storage == STORAGE_BUFFER) {
        iVar3 = 4;
        if ((pAVar5->inputType & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          iVar3 = inputTypeSize::size[(int)pAVar5->inputType];
        }
        iVar1 = 1;
        if (pAVar5->stride % iVar3 == 0) goto LAB_00809dcc;
      }
      else {
LAB_00809dcc:
        iVar1 = iVar9;
      }
      iVar9 = iVar1;
      pAVar5 = pAVar5 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    CVar2 = iVar9 * 2;
  }
  bVar8 = bVar7;
  if (((*(uint *)((anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
                 (long)(int)this->drawMethod * 6) & 1) != 0) &&
     (this->indexStorage == STORAGE_BUFFER)) {
    uVar6 = 0xffffffff;
    if ((ulong)this->indexType < 3) {
      uVar6 = *(uint *)(&DAT_009eaba8 + (ulong)this->indexType * 4);
    }
    bVar8 = true;
    if ((this->indexPointerOffset & uVar6) == 0) {
      bVar8 = bVar7;
    }
  }
  if (bVar8) {
    CVar2 = COMPATIBILITY_UNALIGNED_OFFSET;
  }
  return CVar2;
}

Assistant:

DrawTestSpec::CompatibilityTestType DrawTestSpec::isCompatibilityTest (void) const
{
	const MethodInfo methodInfo = getMethodInfo(drawMethod);

	bool bufferAlignmentBad = false;
	bool strideAlignmentBad = false;

	// Attribute buffer alignment
	for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
		if (!attribs[ndx].isBufferAligned())
			bufferAlignmentBad = true;

	// Attribute stride alignment
	for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
		if (!attribs[ndx].isBufferStrideAligned())
			strideAlignmentBad = true;

	// Index buffer alignment
	if (methodInfo.indexed)
	{
		if (indexStorage == STORAGE_BUFFER)
		{
			int indexSize = 0;
			if (indexType == INDEXTYPE_BYTE)
				indexSize = 1;
			else if (indexType == INDEXTYPE_SHORT)
				indexSize = 2;
			else if (indexType == INDEXTYPE_INT)
				indexSize = 4;
			else
				DE_ASSERT(DE_FALSE);

			if (indexPointerOffset % indexSize != 0)
				bufferAlignmentBad = true;
		}
	}

	// \note combination bad alignment & stride is treated as bad offset
	if (bufferAlignmentBad)
		return COMPATIBILITY_UNALIGNED_OFFSET;
	else if (strideAlignmentBad)
		return COMPATIBILITY_UNALIGNED_STRIDE;
	else
		return COMPATIBILITY_NONE;
}